

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_sleep(int ms)

{
  int iVar1;
  sqlite3_vfs *psVar2;
  
  iVar1 = 0;
  psVar2 = sqlite3_vfs_find((char *)0x0);
  if (psVar2 != (sqlite3_vfs *)0x0) {
    iVar1 = (*psVar2->xSleep)(psVar2,ms * 1000);
    iVar1 = iVar1 / 1000;
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_sleep(int ms){
  sqlite3_vfs *pVfs;
  int rc;
  pVfs = sqlite3_vfs_find(0);
  if( pVfs==0 ) return 0;

  /* This function works in milliseconds, but the underlying OsSleep() 
  ** API uses microseconds. Hence the 1000's.
  */
  rc = (sqlite3OsSleep(pVfs, 1000*ms)/1000);
  return rc;
}